

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

void Bmc_CexCarePropagateFwdOne(Gia_Man_t *p,Abc_Cex_t *pCex,int f,int fGrow)

{
  int iVar1;
  int c;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_6c;
  int local_68;
  int Phase1;
  int Phase0;
  int i;
  int Prio1;
  int Prio0;
  int Prio;
  Gia_Obj_t *pObj;
  int fGrow_local;
  int f_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  if ((fGrow & 2U) == 0) {
    Phase1 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar7 = false;
      if (Phase1 < iVar1) {
        _Prio0 = Gia_ManCi(p,Phase1);
        bVar7 = _Prio0 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = pCex->nPis;
      iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + pCex->nPis * f + Phase1);
      uVar5 = Abc_Var2Lit(f * iVar1 + Phase1 + 1,iVar2);
      _Prio0->Value = uVar5;
      Phase1 = Phase1 + 1;
    }
  }
  else {
    Phase1 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar7 = false;
      if (Phase1 < iVar1) {
        _Prio0 = Gia_ManCi(p,Phase1);
        bVar7 = _Prio0 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = pCex->nPis;
      iVar2 = pCex->nPis;
      c = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + pCex->nPis * f + Phase1);
      uVar5 = Abc_Var2Lit(f * iVar1 + (iVar2 - Phase1),c);
      _Prio0->Value = uVar5;
      Phase1 = Phase1 + 1;
    }
  }
  Phase1 = 0;
  while( true ) {
    bVar7 = false;
    if (Phase1 < p->nObjs) {
      _Prio0 = Gia_ManObj(p,Phase1);
      bVar7 = _Prio0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_Prio0);
    if (iVar1 != 0) {
      pGVar6 = Gia_ObjFanin0(_Prio0);
      iVar1 = Abc_Lit2Var(pGVar6->Value);
      pGVar6 = Gia_ObjFanin1(_Prio0);
      iVar2 = Abc_Lit2Var(pGVar6->Value);
      pGVar6 = Gia_ObjFanin0(_Prio0);
      uVar3 = Abc_LitIsCompl(pGVar6->Value);
      uVar5 = Gia_ObjFaninC0(_Prio0);
      uVar3 = uVar3 ^ uVar5;
      pGVar6 = Gia_ObjFanin1(_Prio0);
      uVar4 = Abc_LitIsCompl(pGVar6->Value);
      uVar5 = Gia_ObjFaninC1(_Prio0);
      uVar4 = uVar4 ^ uVar5;
      if ((uVar3 == 0) || (uVar4 == 0)) {
        if (((uVar3 == 0) || (Prio1 = iVar2, uVar4 != 0)) &&
           ((uVar3 != 0 || (Prio1 = iVar1, uVar4 == 0)))) {
          if ((fGrow & 1U) == 0) {
            local_6c = Abc_MinInt(iVar1,iVar2);
          }
          else {
            local_6c = Abc_MaxInt(iVar1,iVar2);
          }
          Prio1 = local_6c;
        }
      }
      else {
        if ((fGrow & 1U) == 0) {
          local_68 = Abc_MaxInt(iVar1,iVar2);
        }
        else {
          local_68 = Abc_MinInt(iVar1,iVar2);
        }
        Prio1 = local_68;
      }
      uVar5 = Abc_Var2Lit(Prio1,uVar3 & uVar4);
      _Prio0->Value = uVar5;
    }
    Phase1 = Phase1 + 1;
  }
  Phase1 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (Phase1 < iVar1) {
      _Prio0 = Gia_ManCo(p,Phase1);
      bVar7 = _Prio0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pGVar6 = Gia_ObjFanin0(_Prio0);
    uVar5 = pGVar6->Value;
    iVar1 = Gia_ObjFaninC0(_Prio0);
    uVar5 = Abc_LitNotCond(uVar5,iVar1);
    _Prio0->Value = uVar5;
    Phase1 = Phase1 + 1;
  }
  return;
}

Assistant:

void Bmc_CexCarePropagateFwdOne( Gia_Man_t * p, Abc_Cex_t * pCex, int f, int fGrow )
{
    Gia_Obj_t * pObj;
    int Prio, Prio0, Prio1;
    int i, Phase0, Phase1;
    if ( (fGrow & 2) )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + (pCex->nPis-1-i) + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Abc_Var2Lit( f * pCex->nPis + i + 1, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Prio0  = Abc_Lit2Var(Gia_ObjFanin0(pObj)->Value);
        Prio1  = Abc_Lit2Var(Gia_ObjFanin1(pObj)->Value);
        Phase0 = Abc_LitIsCompl(Gia_ObjFanin0(pObj)->Value) ^ Gia_ObjFaninC0(pObj);
        Phase1 = Abc_LitIsCompl(Gia_ObjFanin1(pObj)->Value) ^ Gia_ObjFaninC1(pObj);
        if ( Phase0 && Phase1 )
            Prio = (fGrow & 1) ? Abc_MinInt(Prio0, Prio1) : Abc_MaxInt(Prio0, Prio1);
        else if ( Phase0 && !Phase1 )
            Prio = Prio1;
        else if ( !Phase0 && Phase1 )
            Prio = Prio0;
        else // if ( !Phase0 && !Phase1 )
            Prio = (fGrow & 1) ? Abc_MaxInt(Prio0, Prio1) : Abc_MinInt(Prio0, Prio1);
        pObj->Value = Abc_Var2Lit( Prio, Phase0 & Phase1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
}